

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_short,unsigned_short>
          (Thread *this,UnopFunc<unsigned_short,_unsigned_short> *f)

{
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  unsigned_short *__first;
  unsigned_short *__last;
  unsigned_short *__result;
  unsigned_short local_38 [4];
  SR result;
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  UnopFunc<unsigned_short,_unsigned_short> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  __first = std::begin<unsigned_short,8ul>((unsigned_short (*) [8])(result.v + 4));
  __last = std::end<unsigned_short,8ul>((unsigned_short (*) [8])(result.v + 4));
  __result = std::begin<unsigned_short,8ul>((unsigned_short (*) [8])local_38);
  std::transform<unsigned_short*,unsigned_short*,unsigned_short(*)(unsigned_short)>
            (__first,__last,__result,f);
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = local_38[0];
  value.v[1] = local_38[1];
  value.v[2] = local_38[2];
  value.v[3] = local_38[3];
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}